

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::Storage::Storage<>(Storage *this,fltSemantics *Semantics)

{
  bool bVar1;
  fltSemantics *Semantics_local;
  Storage *this_local;
  
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(Semantics);
  if (bVar1) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,Semantics);
  }
  else {
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(Semantics);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x2bd);
    }
    detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)this,Semantics);
  }
  return;
}

Assistant:

Storage(const fltSemantics &Semantics, ArgTypes &&... Args) {
      if (usesLayout<IEEEFloat>(Semantics)) {
        new (&IEEE) IEEEFloat(Semantics, std::forward<ArgTypes>(Args)...);
        return;
      }
      if (usesLayout<DoubleAPFloat>(Semantics)) {
        new (&Double) DoubleAPFloat(Semantics, std::forward<ArgTypes>(Args)...);
        return;
      }
      llvm_unreachable("Unexpected semantics");
    }